

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

AssertionResult * __thiscall
Catch::ResultBuilder::build(AssertionResult *__return_storage_ptr__,ResultBuilder *this)

{
  bool bVar1;
  string sStack_98;
  undefined1 local_78 [64];
  OfType local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((this->m_data).resultType != Unknown) {
    AssertionResultData::AssertionResultData((AssertionResultData *)local_78,&this->m_data);
    if ((this->m_exprComponents).testFalse == true) {
      if (local_38 == Ok) {
        local_38 = ExpressionFailed;
      }
      else if (local_38 == ExpressionFailed) {
        local_38 = Ok;
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)(local_78 + 0x20));
    std::__cxx11::string::_M_dispose();
    reconstructExpression_abi_cxx11_(&sStack_98,this);
    std::__cxx11::string::_M_assign((string *)local_78);
    std::__cxx11::string::_M_dispose();
    if ((this->m_exprComponents).testFalse == true) {
      bVar1 = std::operator==(&(this->m_exprComponents).op,"");
      if (bVar1) {
        std::operator+(&sStack_98,"!",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
        std::__cxx11::string::_M_assign((string *)local_78);
        std::__cxx11::string::_M_dispose();
      }
      else {
        std::operator+(&local_30,"!(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
        std::operator+(&sStack_98,&local_30,")");
        std::__cxx11::string::_M_assign((string *)local_78);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
      }
    }
    AssertionResult::AssertionResult
              (__return_storage_ptr__,&this->m_assertionInfo,(AssertionResultData *)local_78);
    AssertionResultData::~AssertionResultData((AssertionResultData *)local_78);
    return __return_storage_ptr__;
  }
  __assert_fail("m_data.resultType != ResultWas::Unknown",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nopppers[P]03-lambda-stuff/lib/catch.hpp"
                ,0x2088,"AssertionResult Catch::ResultBuilder::build() const");
}

Assistant:

AssertionResult ResultBuilder::build() const
    {
        assert( m_data.resultType != ResultWas::Unknown );

        AssertionResultData data = m_data;

        // Flip bool results if testFalse is set
        if( m_exprComponents.testFalse ) {
            if( data.resultType == ResultWas::Ok )
                data.resultType = ResultWas::ExpressionFailed;
            else if( data.resultType == ResultWas::ExpressionFailed )
                data.resultType = ResultWas::Ok;
        }

        data.message = m_stream.oss.str();
        data.reconstructedExpression = reconstructExpression();
        if( m_exprComponents.testFalse ) {
            if( m_exprComponents.op == "" )
                data.reconstructedExpression = "!" + data.reconstructedExpression;
            else
                data.reconstructedExpression = "!(" + data.reconstructedExpression + ")";
        }
        return AssertionResult( m_assertionInfo, data );
    }